

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O3

ServiceServer __thiscall
miniros::NodeHandle::
advertiseService<minibag::Player,std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
          (NodeHandle *this,string *service,offset_in_Player_to_subr srv_func,Player *obj)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ServiceServer SVar1;
  AdvertiseServiceOptions ops;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  AdvertiseServiceOptions local_f8;
  
  local_f8.service._M_dataplus._M_p = (pointer)&local_f8.service.field_2;
  local_f8.service._M_string_length = 0;
  local_f8.service.field_2._M_local_buf[0] = '\0';
  local_f8.md5sum._M_dataplus._M_p = (pointer)&local_f8.md5sum.field_2;
  local_f8.md5sum._M_string_length = 0;
  local_f8.md5sum.field_2._M_local_buf[0] = '\0';
  local_f8.datatype._M_dataplus._M_p = (pointer)&local_f8.datatype.field_2;
  local_f8.datatype._M_string_length = 0;
  local_f8.datatype.field_2._M_local_buf[0] = '\0';
  local_f8.req_datatype._M_dataplus._M_p = (pointer)&local_f8.req_datatype.field_2;
  local_f8.req_datatype._M_string_length = 0;
  local_f8.req_datatype.field_2._M_local_buf[0] = '\0';
  local_f8.res_datatype._M_dataplus._M_p = (pointer)&local_f8.res_datatype.field_2;
  local_f8.res_datatype._M_string_length = 0;
  local_f8.res_datatype.field_2._M_local_buf[0] = '\0';
  local_f8.helper.super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_f8.helper.super___shared_ptr<miniros::ServiceCallbackHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f8.callback_queue = (CallbackQueueInterface *)0x0;
  local_f8.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_f8.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_118._M_unused._0_8_ = in_R9;
  *(Player **)((long)local_118._M_unused._0_8_ + 8) = obj;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x10) = in_R8;
  local_100 = std::
              _Function_handler<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/node_handle.h:918:7)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/node_handle.h:918:7)>
              ::_M_manager;
  AdvertiseServiceOptions::
  init<std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
            (&local_f8,(string *)srv_func,
             (function<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&)>
              *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  miniros::NodeHandle::advertiseService((AdvertiseServiceOptions *)this);
  AdvertiseServiceOptions::~AdvertiseServiceOptions(&local_f8);
  SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ServiceServer)
         SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceServer advertiseService(const std::string& service, bool (T::*srv_func)(MReq &, MRes &), T *obj)
  {
    AdvertiseServiceOptions ops;
    auto wrapFn =
      [obj, srv_func](MReq& req, MRes& res)
      {
        return (obj->*srv_func)(req, res);
      };
    ops.template init<MReq, MRes>(service, wrapFn);
    return advertiseService(ops);
  }